

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_updateTree(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend)

{
  long lVar1;
  uint uVar2;
  U32 UVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  U32 forward;
  U32 idx;
  U32 target;
  BYTE *base;
  int in_stack_0000008c;
  U32 in_stack_00000090;
  U32 in_stack_00000094;
  BYTE *in_stack_00000098;
  BYTE *in_stack_000000a0;
  ZSTD_matchState_t *in_stack_000000a8;
  uint local_30;
  
  lVar1 = *(long *)(in_RDI + 8);
  uVar2 = (int)in_RSI - (int)lVar1;
  for (local_30 = *(uint *)(in_RDI + 0x2c); local_30 < uVar2; local_30 = UVar3 + local_30) {
    UVar3 = ZSTD_insertBt1(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094,
                           in_stack_00000090,in_stack_0000008c);
    if (local_30 + UVar3 <= local_30) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if (0xffffffff < (ulong)(in_RSI - lVar1)) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (0xffffffff < (ulong)(in_RDX - lVar1)) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  *(uint *)(in_RDI + 0x2c) = uVar2;
  return;
}

Assistant:

void ZSTD_updateTree(ZSTD_matchState_t* ms, const BYTE* ip, const BYTE* iend) {
    ZSTD_updateTree_internal(ms, ip, iend, ms->cParams.minMatch, ZSTD_noDict);
}